

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField32.c
# Opt level: O2

void Hacl_GenericField32_exp_vartime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *aM,uint32_t bBits,
               uint32_t *b,uint32_t *resM)

{
  uint32_t *puVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  uint32_t *a;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  uint32_t uVar7;
  ulong uVar8;
  uint32_t len;
  uint32_t *puVar9;
  uint32_t *puVar10;
  uint32_t *ctx_n0;
  uint32_t *puVar11;
  ulong uVar12;
  uint32_t i;
  uint uVar13;
  uint32_t auStack_c0 [4];
  ulong local_b0;
  uint32_t *local_a8;
  uint32_t *t11_3;
  uint32_t *t11_2;
  uint32_t *t11_1;
  uint32_t *local_88;
  uint32_t local_7c;
  uint32_t *local_78;
  uint32_t *ctx_r2;
  uint32_t *t11;
  uint32_t *ctx_n;
  uint32_t *local_58;
  uint32_t *local_50;
  size_t local_48;
  uint32_t local_3c;
  ulong local_38;
  
  uVar13 = k->len;
  uVar8 = (ulong)uVar13;
  local_78 = k->n;
  local_3c = k->mu;
  ctx_n = k->r2;
  uVar12 = uVar8 * 4 + 0xf & 0xfffffffffffffff0;
  puVar11 = (uint32_t *)((long)auStack_c0 + -uVar12 + 8);
  sVar2 = uVar8 * 4;
  local_88 = b;
  local_58 = puVar11;
  *(undefined8 *)((long)auStack_c0 + -uVar12) = 0x13975d;
  memcpy(puVar11,aM,sVar2);
  local_50 = resM;
  local_38 = uVar8;
  if (bBits < 200) {
    puVar11 = (uint32_t *)((long)puVar11 - ((ulong)(uVar13 * 2) * 4 + 0xf & 0xfffffffffffffff0));
    puVar11[-2] = 0x13979e;
    puVar11[-1] = 0;
    memset(puVar11,0,(ulong)(uVar13 * 2) << 2);
    puVar1 = local_78;
    puVar11[-2] = 0x1397ad;
    puVar11[-1] = 0;
    memcpy(puVar11,puVar1,sVar2);
    puVar1 = ctx_n;
    t11 = puVar11 + uVar8;
    puVar11[-2] = 0x1397c1;
    puVar11[-1] = 0;
    memcpy(puVar11 + uVar8,puVar1,sVar2);
    uVar4 = local_3c;
    puVar6 = local_50;
    puVar1 = t11;
    puVar11[-2] = 0x1397d6;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar13,puVar11,uVar4,puVar1,puVar6);
    uVar8 = local_38;
    puVar1 = local_58;
    t11_1 = (uint32_t *)(ulong)bBits;
    for (uVar13 = 0; uVar4 = local_3c, puVar6 = local_50, (uint)t11_1 != uVar13; uVar13 = uVar13 + 1
        ) {
      if ((local_88[uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) {
        puVar11[-2] = 0x13981c;
        puVar11[-1] = 0;
        Hacl_Bignum_Montgomery_bn_mont_mul_u32((uint32_t)uVar8,puVar11,uVar4,puVar6,puVar1,puVar6);
      }
      puVar11[-2] = 0x13982f;
      puVar11[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32((uint32_t)uVar8,puVar11,uVar4,puVar1,puVar1);
    }
  }
  else {
    local_7c = (bBits - 1 >> 5) + 1;
    ctx_r2 = (uint32_t *)(ulong)(uVar13 * 2);
    puVar11 = (uint32_t *)((long)puVar11 - ((long)ctx_r2 * 4 + 0xfU & 0xfffffffffffffff0));
    __n = (long)ctx_r2 * 4;
    puVar11[-2] = 0x139878;
    puVar11[-1] = 0;
    memset(puVar11,0,__n);
    puVar1 = local_78;
    puVar11[-2] = 0x139887;
    puVar11[-1] = 0;
    memcpy(puVar11,puVar1,sVar2);
    puVar1 = ctx_n;
    local_78 = puVar11 + uVar8;
    puVar11[-2] = 0x1398a2;
    puVar11[-1] = 0;
    memcpy(puVar11 + uVar8,puVar1,sVar2);
    puVar9 = puVar11 + -(ulong)(uVar13 << 4);
    puVar9[-2] = 0x1398be;
    puVar9[-1] = 0;
    memset(puVar9,0,(ulong)(uVar13 << 4) * 4);
    puVar10 = (uint32_t *)((long)puVar9 - uVar12);
    local_b0 = uVar12;
    puVar10[-2] = 0x1398db;
    puVar10[-1] = 0;
    memset(puVar10,0,sVar2);
    uVar8 = local_38;
    uVar4 = local_3c;
    puVar6 = local_78;
    puVar1 = puVar9 + local_38;
    ctx_n = puVar9;
    local_48 = sVar2;
    puVar10[-2] = 0x139901;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32((uint32_t)uVar8,puVar11,uVar4,puVar6,puVar9);
    sVar2 = local_48;
    puVar6 = local_58;
    puVar10[-2] = 0x139911;
    puVar10[-1] = 0;
    memcpy(puVar1,puVar6,sVar2);
    uVar8 = local_38;
    uVar4 = local_3c;
    t11 = puVar11;
    puVar10[-2] = 0x139931;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32((uint32_t)uVar8,puVar11,uVar4,puVar1,puVar10);
    sVar2 = local_48;
    puVar1 = ctx_n + (long)ctx_r2;
    puVar10[-2] = 0x13994c;
    puVar10[-1] = 0;
    memcpy(puVar1,puVar10,sVar2);
    uVar8 = local_38;
    puVar6 = local_58;
    puVar10[-2] = 0x139965;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32((uint32_t)uVar8,puVar11,uVar4,puVar6,puVar1,puVar10);
    sVar2 = local_48;
    puVar6 = ctx_n;
    puVar11 = ctx_n + (uint)((int)local_38 * 3);
    ctx_r2 = puVar11;
    puVar10[-2] = 0x139984;
    puVar10[-1] = 0;
    memcpy(puVar11,puVar10,sVar2);
    uVar8 = local_38;
    uVar4 = local_3c;
    puVar11 = t11;
    puVar10[-2] = 0x13999d;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32((uint32_t)uVar8,puVar11,uVar4,puVar1,puVar10);
    sVar2 = local_48;
    puVar6 = puVar6 + (uint)((int)local_38 * 4);
    t11_2 = puVar6;
    puVar10[-2] = 0x1399c2;
    puVar10[-1] = 0;
    memcpy(puVar6,puVar10,sVar2);
    uVar8 = local_38;
    uVar4 = local_3c;
    puVar1 = local_58;
    puVar10[-2] = 0x1399df;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32((uint32_t)uVar8,puVar11,uVar4,puVar1,puVar6,puVar10);
    sVar2 = local_48;
    puVar1 = ctx_n;
    puVar11 = ctx_n + (uint)((int)local_38 * 5);
    t11_3 = puVar11;
    puVar10[-2] = 0x139a01;
    puVar10[-1] = 0;
    memcpy(puVar11,puVar10,sVar2);
    uVar8 = local_38;
    puVar6 = t11;
    puVar11 = ctx_r2;
    puVar10[-2] = 0x139a18;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32((uint32_t)uVar8,puVar6,uVar4,puVar11,puVar10);
    sVar2 = local_48;
    puVar1 = puVar1 + (uint)((int)local_38 * 6);
    local_a8 = puVar1;
    puVar10[-2] = 0x139a36;
    puVar10[-1] = 0;
    memcpy(puVar1,puVar10,sVar2);
    uVar8 = local_38;
    puVar11 = local_58;
    puVar6 = t11;
    puVar10[-2] = 0x139a53;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32((uint32_t)uVar8,puVar6,uVar4,puVar11,puVar1,puVar10);
    sVar2 = local_48;
    puVar1 = ctx_n;
    puVar11 = ctx_n + (uint)((int)local_38 * 7);
    ctx_r2 = puVar11;
    puVar10[-2] = 0x139a6f;
    puVar10[-1] = 0;
    memcpy(puVar11,puVar10,sVar2);
    uVar8 = local_38;
    puVar11 = t11_2;
    puVar10[-2] = 0x139a88;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32((uint32_t)uVar8,puVar6,uVar4,puVar11,puVar10);
    sVar2 = local_48;
    iVar3 = (int)local_38;
    puVar10[-2] = 0x139aa6;
    puVar10[-1] = 0;
    memcpy(puVar1 + (uint)(iVar3 * 8),puVar10,sVar2);
    uVar8 = local_38;
    uVar4 = local_3c;
    puVar11 = local_58;
    puVar10[-2] = 0x139ac1;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32
              ((uint32_t)uVar8,puVar6,uVar4,puVar11,puVar1 + (uint)(iVar3 * 8),puVar10);
    sVar2 = local_48;
    puVar9 = ctx_n;
    puVar11 = ctx_n + (uint)((int)local_38 * 9);
    puVar10[-2] = 0x139adc;
    puVar10[-1] = 0;
    memcpy(puVar11,puVar10,sVar2);
    uVar8 = local_38;
    puVar11 = t11_3;
    puVar10[-2] = 0x139af7;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32((uint32_t)uVar8,puVar6,uVar4,puVar11,puVar10);
    sVar2 = local_48;
    puVar11 = puVar9 + (uint)((int)local_38 * 10);
    puVar10[-2] = 0x139b11;
    puVar10[-1] = 0;
    memcpy(puVar11,puVar10,sVar2);
    uVar8 = local_38;
    puVar6 = local_58;
    puVar1 = t11;
    puVar10[-2] = 0x139b2b;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32((uint32_t)uVar8,puVar1,uVar4,puVar6,puVar11,puVar10);
    sVar2 = local_48;
    uVar13 = (int)local_38 * 0xb;
    puVar10[-2] = 0x139b3f;
    puVar10[-1] = 0;
    memcpy(puVar9 + uVar13,puVar10,sVar2);
    uVar8 = local_38;
    puVar1 = t11;
    puVar11 = local_a8;
    puVar10[-2] = 0x139b5f;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32((uint32_t)uVar8,puVar1,uVar4,puVar11,puVar10);
    sVar2 = local_48;
    puVar11 = ctx_n + (uint)((int)local_38 * 0xc);
    puVar10[-2] = 0x139b7a;
    puVar10[-1] = 0;
    memcpy(puVar11,puVar10,sVar2);
    uVar8 = local_38;
    puVar6 = local_58;
    puVar10[-2] = 0x139b95;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32((uint32_t)uVar8,puVar1,uVar4,puVar6,puVar11,puVar10);
    sVar2 = local_48;
    puVar9 = ctx_n;
    puVar11 = ctx_n + (uint)((int)local_38 * 0xd);
    puVar10[-2] = 0x139bad;
    puVar10[-1] = 0;
    memcpy(puVar11,puVar10,sVar2);
    uVar8 = local_38;
    puVar1 = t11;
    puVar11 = ctx_r2;
    puVar10[-2] = 0x139bc4;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32((uint32_t)uVar8,puVar1,uVar4,puVar11,puVar10);
    sVar2 = local_48;
    uVar13 = (int)local_38 * 0xe;
    puVar10[-2] = 0x139bdb;
    puVar10[-1] = 0;
    memcpy(puVar9 + uVar13,puVar10,sVar2);
    uVar8 = local_38;
    uVar4 = local_3c;
    puVar11 = local_58;
    puVar6 = t11;
    puVar10[-2] = 0x139bff;
    puVar10[-1] = 0;
    len = (uint32_t)uVar8;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(len,puVar6,uVar4,puVar11,puVar9 + uVar13,puVar10);
    sVar2 = local_48;
    uVar7 = (uint32_t)puVar11;
    puVar10[-2] = 0x139c15;
    puVar10[-1] = 0;
    memcpy(puVar9 + len * 0xf,puVar10,sVar2);
    uVar5 = local_3c;
    a = local_50;
    puVar1 = local_78;
    uVar4 = local_7c;
    puVar11 = local_88;
    if ((bBits & 3) == 0) {
      puVar10[-2] = 0x139c5b;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(len,puVar6,uVar5,puVar1,a);
      uVar13 = bBits;
    }
    else {
      puVar10[-2] = 0x139c34;
      puVar10[-1] = 0;
      uVar4 = Hacl_Bignum_Lib_bn_get_bits_u32(uVar4,puVar11,bBits & 0xfffffffc,uVar7);
      puVar11 = local_50;
      puVar10[-2] = 0x139c47;
      puVar10[-1] = 0;
      memcpy(puVar11,puVar9 + uVar4 * len,sVar2);
      uVar13 = bBits & 0xfffffffc;
    }
    puVar10 = (uint32_t *)((long)puVar10 - local_b0);
    local_58 = puVar10;
    puVar10[-2] = 0x139c79;
    puVar10[-1] = 0;
    memset(puVar10,0,sVar2);
    uVar8 = local_38;
    puVar1 = t11;
    puVar11 = (uint32_t *)(ulong)(bBits >> 2);
    while( true ) {
      uVar4 = local_3c;
      puVar6 = local_50;
      uVar13 = uVar13 - 4;
      t11_1 = (uint32_t *)(ulong)((int)puVar11 - 1);
      if ((int)puVar11 == 0) break;
      uVar7 = (uint32_t)uVar8;
      puVar10[-2] = 0x139cb3;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar7,puVar1,uVar4,puVar6,puVar6);
      puVar11 = local_50;
      puVar10[-2] = 0x139cc8;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar7,puVar1,uVar4,puVar11,puVar11);
      puVar11 = local_50;
      puVar10[-2] = 0x139cdd;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar7,puVar1,uVar4,puVar11,puVar11);
      puVar6 = local_50;
      puVar10[-2] = 0x139cf2;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar7,puVar1,uVar4,puVar6,puVar6);
      uVar5 = local_7c;
      puVar11 = local_88;
      puVar10[-2] = 0x139d01;
      puVar10[-1] = 0;
      uVar5 = Hacl_Bignum_Lib_bn_get_bits_u32(uVar5,puVar11,uVar13,(uint32_t)puVar6);
      sVar2 = local_48;
      puVar6 = local_58;
      puVar11 = ctx_n + uVar5 * uVar7;
      puVar10[-2] = 0x139d1f;
      puVar10[-1] = 0;
      memcpy(puVar6,puVar11,sVar2);
      puVar9 = local_50;
      puVar11 = t11_1;
      puVar10[-2] = 0x139d40;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar7,puVar1,uVar4,puVar9,puVar6,puVar9);
    }
  }
  return;
}

Assistant:

void
Hacl_GenericField32_exp_vartime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *aM,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *resM
)
{
  uint32_t len1 = Hacl_GenericField32_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint32_t), k1.len);
  uint32_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint32_t));
  memcpy(aMc, aM, k1.len * sizeof (uint32_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 32U;
      uint32_t j = i % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      if (!(bit == 0U))
      {
        uint32_t *ctx_n0 = ctx;
        Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n0, k1.mu, resM, aMc, resM);
      }
      uint32_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n0, k1.mu, aMc, aMc);
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 32U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), 16U * len1);
    uint32_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint32_t));
    uint32_t *t0 = table;
    uint32_t *t1 = table + len1;
    uint32_t *ctx_n0 = ctx;
    uint32_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint32_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint32_t *t11 = table + (i + 1U) * len1;
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint32_t));
      uint32_t *t2 = table + (2U * i + 2U) * len1;
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint32_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i = bBits / 4U * 4U;
      uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i, 4U);
      uint32_t bits_l32 = bits_c;
      const uint32_t *a_bits_l = table + bits_l32 * len1;
      memcpy(resM, (uint32_t *)a_bits_l, len1 * sizeof (uint32_t));
    }
    else
    {
      uint32_t *ctx_n = ctx;
      uint32_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint32_t));
    for (uint32_t i = 0U; i < bBits / 4U; i++)
    {
      KRML_MAYBE_FOR4(i0,
        0U,
        4U,
        1U,
        uint32_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i - 4U;
      uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k2, 4U);
      uint32_t bits_l32 = bits_l;
      const uint32_t *a_bits_l = table + bits_l32 * len1;
      memcpy(tmp0, (uint32_t *)a_bits_l, len1 * sizeof (uint32_t));
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}